

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

void __thiscall Minisat::DoubleOption::help(DoubleOption *this,bool verbose)

{
  byte in_SIL;
  long in_RDI;
  char local_31;
  char local_a;
  
  local_a = '[';
  if ((*(byte *)(in_RDI + 0x38) & 1) == 0) {
    local_a = '(';
  }
  local_31 = ']';
  if ((*(byte *)(in_RDI + 0x39) & 1) == 0) {
    local_31 = ')';
  }
  fprintf(_stderr,"  -%-12s = %-8s %c%4.2g .. %4.2g%c (default: %g)\n",
          *(undefined8 *)(in_RDI + 0x28),*(undefined8 *)(in_RDI + 0x30),
          *(undefined8 *)(in_RDI + 0x40),*(undefined8 *)(in_RDI + 8),*(undefined8 *)(in_RDI + 0x20),
          (ulong)(uint)(int)local_a,(ulong)(uint)(int)local_31);
  if ((in_SIL & 1) != 0) {
    fprintf(_stderr,"\n        %s\n",*(undefined8 *)(in_RDI + 0x10));
    fprintf(_stderr,"\n");
  }
  return;
}

Assistant:

virtual void help (bool verbose = false){
        fprintf(stderr, "  -%-12s = %-8s %c%4.2g .. %4.2g%c (default: %g)\n", 
                name, type_name, 
                range.begin_inclusive ? '[' : '(', 
                range.begin,
                range.end,
                range.end_inclusive ? ']' : ')', 
                value);
        if (verbose){
            fprintf(stderr, "\n        %s\n", description);
            fprintf(stderr, "\n");
        }
    }